

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O0

IceTFloat * icetImageGetColorcf(IceTImage image)

{
  IceTEnum IVar1;
  IceTEnum color_format;
  IceTImage image_local;
  
  IVar1 = icetImageGetColorFormat(image);
  if (IVar1 == 0xc002) {
    image_local.opaque_internals = icetImageGetColorConstVoid(image,(IceTSizeType *)0x0);
  }
  else {
    icetRaiseDiagnostic("Color format is not of type float.",0xfffffffb,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/image.c"
                        ,0x2ae);
    image_local.opaque_internals = (IceTVoid *)0x0;
  }
  return (IceTFloat *)image_local.opaque_internals;
}

Assistant:

const IceTFloat *icetImageGetColorcf(const IceTImage image)
{
    IceTEnum color_format = icetImageGetColorFormat(image);

    if (color_format != ICET_IMAGE_COLOR_RGBA_FLOAT) {
        icetRaiseError("Color format is not of type float.",
                       ICET_INVALID_OPERATION);
        return NULL;
    }

    return icetImageGetColorConstVoid(image, NULL);
}